

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O1

SurfaceInteraction *
pbrt::Triangle::InteractionFromIntersection
          (SurfaceInteraction *__return_storage_ptr__,TriangleMesh *mesh,int triIndex,
          TriangleIntersection *ti,Float time,Vector3f *wo)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar17;
  undefined4 uVar18;
  ulong uVar13;
  ulong uVar14;
  undefined8 uVar15;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  ulong uVar16;
  undefined4 uVar27;
  undefined4 uVar28;
  bool bVar29;
  bool bVar30;
  int *piVar31;
  Point3f *pPVar32;
  Point2f *pPVar33;
  Normal3f *pNVar34;
  Vector3f *pVVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  undefined1 auVar39 [16];
  Point3fi pi;
  Normal3f dndvs;
  int iVar40;
  long lVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar67;
  float fVar68;
  float fVar70;
  float fVar71;
  float fVar72;
  undefined1 auVar69 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined4 uVar87;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  float fVar102;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [64];
  undefined1 auVar115 [16];
  undefined1 auVar116 [64];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 in_ZMM18 [64];
  undefined1 in_ZMM21 [64];
  undefined1 in_ZMM22 [64];
  Vector3f dpdu;
  Vector3f dpdv;
  Normal3f ns;
  Vector3f dpdus;
  Vector3f dpdvs;
  Normal3f dndus;
  int vb;
  undefined4 local_1a8;
  float va;
  undefined4 uStack_19c;
  undefined4 local_198;
  float local_190;
  uint local_18c;
  uint uStack_188;
  uint local_184;
  float fStack_180;
  Float local_17c;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined8 local_158;
  float local_150;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  Tuple3<pbrt::Vector3,_float> *local_f0;
  Tuple3<pbrt::Point3,_float> local_e8;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  Tuple3<pbrt::Vector3,_float> local_58;
  Point3fi local_48;
  
  piVar31 = mesh->vertexIndices;
  pPVar32 = mesh->p;
  lVar41 = (long)(triIndex * 3);
  fVar68 = pPVar32[piVar31[lVar41]].super_Tuple3<pbrt::Point3,_float>.z;
  fVar59 = pPVar32[piVar31[lVar41 + 1]].super_Tuple3<pbrt::Point3,_float>.z;
  auVar50 = ZEXT416((uint)fVar59);
  uVar1 = pPVar32[piVar31[lVar41]].super_Tuple3<pbrt::Point3,_float>.x;
  uVar17 = pPVar32[piVar31[lVar41]].super_Tuple3<pbrt::Point3,_float>.y;
  local_108._4_4_ = uVar17;
  local_108._0_4_ = uVar1;
  local_108._8_8_ = 0;
  uVar2 = pPVar32[piVar31[lVar41 + 1]].super_Tuple3<pbrt::Point3,_float>.x;
  uVar18 = pPVar32[piVar31[lVar41 + 1]].super_Tuple3<pbrt::Point3,_float>.y;
  local_118._4_4_ = uVar18;
  local_118._0_4_ = uVar2;
  local_118._8_8_ = 0;
  uVar13._0_4_ = pPVar32[piVar31[lVar41 + 2]].super_Tuple3<pbrt::Point3,_float>.x;
  uVar13._4_4_ = pPVar32[piVar31[lVar41 + 2]].super_Tuple3<pbrt::Point3,_float>.y;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = uVar13;
  local_128._8_8_ = 0;
  local_128._0_8_ = uVar13;
  fVar58 = pPVar32[piVar31[lVar41 + 2]].super_Tuple3<pbrt::Point3,_float>.z;
  auVar51 = ZEXT416((uint)fVar58);
  pPVar33 = mesh->uv;
  if (pPVar33 == (Point2f *)0x0) {
    auVar55 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
    auVar114 = ZEXT464(0x3f800000);
    auVar54 = auVar114._0_16_;
    auVar116 = ZEXT1664(auVar54);
    auVar53 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
    auVar52 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
  }
  else {
    auVar116 = ZEXT464((uint)pPVar33[piVar31[lVar41 + 2]].super_Tuple2<pbrt::Point2,_float>.x);
    auVar114 = ZEXT464((uint)pPVar33[piVar31[lVar41 + 2]].super_Tuple2<pbrt::Point2,_float>.y);
    auVar54 = ZEXT416((uint)pPVar33[piVar31[lVar41 + 1]].super_Tuple2<pbrt::Point2,_float>.x);
    auVar55 = ZEXT416((uint)pPVar33[piVar31[lVar41 + 1]].super_Tuple2<pbrt::Point2,_float>.y);
    auVar52 = ZEXT416((uint)pPVar33[piVar31[lVar41]].super_Tuple2<pbrt::Point2,_float>.x);
    auVar53 = ZEXT416((uint)pPVar33[piVar31[lVar41]].super_Tuple2<pbrt::Point2,_float>.y);
  }
  local_88 = vsubss_avx512f(auVar52,auVar116._0_16_);
  local_a8 = vsubss_avx512f(auVar53,auVar114._0_16_);
  local_98 = vsubss_avx512f(auVar54,auVar116._0_16_);
  local_b8 = vsubss_avx512f(auVar55,auVar114._0_16_);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = uVar13;
  local_178 = vsubps_avx512vl(local_108,auVar45);
  auVar42 = vsubss_avx512f(ZEXT416((uint)fVar68),ZEXT416((uint)fVar58));
  fVar56 = auVar42._0_4_;
  local_168 = vsubps_avx512vl(local_118,auVar45);
  auVar42 = vsubss_avx512f(ZEXT416((uint)fVar59),ZEXT416((uint)fVar58));
  fVar57 = auVar42._0_4_;
  fVar67 = local_98._0_4_;
  fVar70 = local_a8._0_4_;
  auVar42 = vfmsub213ss_fma(local_b8,local_88,ZEXT416((uint)(fVar70 * fVar67)));
  auVar43._8_4_ = 0x80000000;
  auVar43._0_8_ = 0x8000000080000000;
  auVar43._12_4_ = 0x80000000;
  local_c8 = vxorps_avx512vl(local_a8,auVar43);
  auVar43 = vfnmadd231ss_fma(ZEXT416((uint)(fVar70 * fVar67)),local_a8,local_98);
  fVar102 = auVar42._0_4_ + auVar43._0_4_;
  local_d8 = ZEXT416((uint)fVar102);
  auVar42._8_4_ = 0x7fffffff;
  auVar42._0_8_ = 0x7fffffff7fffffff;
  auVar42._12_4_ = 0x7fffffff;
  local_68 = vandps_avx512vl(local_d8,auVar42);
  local_17c = time;
  local_f0 = &wo->super_Tuple3<pbrt::Vector3,_float>;
  if (local_68._0_4_ < 1e-09) {
LAB_0022531d:
    local_128._8_8_ = 0;
    auVar46 = vsubps_avx512vl(local_128,local_108);
    auVar51 = vmovshdup_avx(auVar46);
    auVar47 = vsubss_avx512f(ZEXT416((uint)fVar58),ZEXT416((uint)fVar68));
    auVar42 = vsubps_avx(local_118,local_108);
    auVar50 = vmovshdup_avx(auVar42);
    auVar48 = vsubss_avx512f(ZEXT416((uint)fVar59),ZEXT416((uint)fVar68));
    auVar45 = ZEXT416((uint)(auVar50._0_4_ * auVar47._0_4_));
    auVar43 = vfmsub213ss_fma(auVar48,auVar51,auVar45);
    auVar45 = vfnmadd231ss_fma(auVar45,auVar47,auVar50);
    fVar102 = auVar43._0_4_ + auVar45._0_4_;
    auVar45 = ZEXT416((uint)(auVar48._0_4_ * auVar46._0_4_));
    auVar43 = vfmsub213ss_fma(auVar42,auVar47,auVar45);
    auVar45 = vfnmadd231ss_fma(auVar45,auVar46,auVar48);
    fVar67 = auVar43._0_4_ + auVar45._0_4_;
    auVar45 = ZEXT416((uint)(auVar42._0_4_ * auVar51._0_4_));
    auVar43 = vfmsub213ss_fma(auVar50,auVar46,auVar45);
    auVar45 = vfnmadd231ss_fma(auVar45,auVar51,auVar42);
    fVar70 = auVar43._0_4_ + auVar45._0_4_;
    auVar111 = ZEXT416((uint)fVar70);
    fVar70 = fVar70 * fVar70 + fVar67 * fVar67 + fVar102 * fVar102;
    if ((fVar70 != 0.0) || (NAN(fVar70))) {
      auVar42 = vinsertps_avx(ZEXT416((uint)fVar102),ZEXT416((uint)fVar67),0x10);
    }
    else {
      auVar84._0_8_ = (double)auVar46._0_4_;
      auVar84._8_8_ = auVar46._8_8_;
      auVar89._0_8_ = (double)auVar51._0_4_;
      auVar89._8_8_ = auVar51._8_8_;
      auVar61._0_8_ = (double)auVar47._0_4_;
      auVar61._8_8_ = auVar47._8_8_;
      auVar94._0_8_ = (double)auVar42._0_4_;
      auVar94._8_8_ = auVar42._8_8_;
      auVar96._0_8_ = (double)auVar50._0_4_;
      auVar96._8_8_ = auVar50._8_8_;
      auVar75._0_8_ = (double)auVar48._0_4_;
      auVar75._8_8_ = auVar48._8_8_;
      auVar103._8_8_ = 0;
      auVar103._0_8_ = auVar96._0_8_ * auVar61._0_8_;
      auVar51 = vfmsub213sd_fma(auVar75,auVar89,auVar103);
      auVar50 = vfnmadd231sd_fma(auVar103,auVar61,auVar96);
      dVar36 = auVar51._0_8_ + auVar50._0_8_;
      auVar106._8_8_ = 0;
      auVar106._0_8_ = auVar75._0_8_ * auVar84._0_8_;
      auVar51 = vfmsub213sd_fma(auVar61,auVar94,auVar106);
      auVar50 = vfnmadd213sd_fma(auVar75,auVar84,auVar106);
      dVar37 = auVar50._0_8_ + auVar51._0_8_;
      auVar50._8_8_ = 0;
      auVar50._0_8_ = auVar94._0_8_ * auVar89._0_8_;
      auVar51 = vfmsub213sd_fma(auVar96,auVar84,auVar50);
      auVar50 = vfnmadd213sd_fma(auVar94,auVar89,auVar50);
      dVar38 = auVar51._0_8_ + auVar50._0_8_;
      auVar51._0_4_ = (float)dVar36;
      auVar51._4_4_ = (int)((ulong)dVar36 >> 0x20);
      auVar51._8_8_ = 0;
      auVar76._0_4_ = (float)dVar37;
      auVar76._4_4_ = (int)((ulong)dVar37 >> 0x20);
      auVar76._8_8_ = 0;
      auVar111._0_4_ = (float)dVar38;
      auVar111._4_4_ = (int)((ulong)dVar38 >> 0x20);
      auVar111._8_8_ = 0;
      fVar102 = auVar111._0_4_ * auVar111._0_4_ +
                auVar76._0_4_ * auVar76._0_4_ + auVar51._0_4_ * auVar51._0_4_;
      _va = CONCAT44(uStack_19c,fVar102);
      _vb = _vb & 0xffffffff00000000;
      if ((fVar102 == 0.0) && (!NAN(fVar102))) {
        LogFatal<char_const(&)[18],char_const(&)[2],char_const(&)[18],float&,char_const(&)[2],int&>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/shapes.h"
                   ,0x38f,"Check failed: %s != %s with %s = %s, %s = %s",
                   (char (*) [18])"LengthSquared(ng)",(char (*) [2])0x287c073,
                   (char (*) [18])"LengthSquared(ng)",&va,(char (*) [2])0x287c073,&vb);
      }
      auVar42 = vinsertps_avx(auVar51,auVar76,0x10);
    }
    auVar62._0_4_ = auVar42._0_4_ * auVar42._0_4_;
    auVar62._4_4_ = auVar42._4_4_ * auVar42._4_4_;
    auVar62._8_4_ = auVar42._8_4_ * auVar42._8_4_;
    auVar62._12_4_ = auVar42._12_4_ * auVar42._12_4_;
    auVar51 = vhaddps_avx(auVar62,auVar62);
    fVar67 = auVar111._0_4_;
    fVar102 = fVar67 * fVar67 + auVar51._0_4_;
    if (fVar102 < 0.0) {
      local_138._0_4_ = fVar58;
      local_148._0_4_ = auVar55._0_4_;
      local_184 = auVar54._0_4_;
      uStack_188 = auVar53._0_4_;
      local_18c = auVar52._0_4_;
      local_190 = fVar67;
      fStack_180 = fVar59;
      local_78 = auVar42;
      fVar102 = sqrtf(fVar102);
      auVar111 = ZEXT416((uint)local_190);
      auVar52 = ZEXT416(local_18c);
      auVar53 = ZEXT416(uStack_188);
      auVar54 = ZEXT416(local_184);
      auVar55 = ZEXT416((uint)local_148._0_4_);
      auVar116 = ZEXT464(auVar116._0_4_);
      auVar114 = ZEXT464(auVar114._0_4_);
      auVar42 = local_78;
      fVar59 = fStack_180;
    }
    else {
      auVar51 = vsqrtss_avx(ZEXT416((uint)fVar102),ZEXT416((uint)fVar102));
      fVar102 = auVar51._0_4_;
      local_138._0_4_ = fVar58;
      local_128 = auVar49;
    }
    auVar51 = ZEXT416((uint)local_138._0_4_);
    auVar50 = ZEXT416((uint)fVar59);
    auVar69._4_4_ = fVar102;
    auVar69._0_4_ = fVar102;
    auVar69._8_4_ = fVar102;
    auVar69._12_4_ = fVar102;
    auVar77._8_4_ = 0x3f800000;
    auVar77._0_8_ = 0x3f8000003f800000;
    auVar77._12_4_ = 0x3f800000;
    auVar49 = vdivps_avx(auVar42,auVar69);
    auVar63._0_4_ = auVar111._0_4_ / fVar102;
    auVar63._4_12_ = auVar111._4_12_;
    auVar85._8_4_ = 0x80000000;
    auVar85._0_8_ = 0x8000000080000000;
    auVar85._12_4_ = 0x80000000;
    auVar45 = vpternlogd_avx512vl(auVar77,auVar63,auVar85,0xf8);
    fVar67 = auVar45._0_4_;
    fVar58 = -1.0 / (auVar63._0_4_ + fVar67);
    auVar42 = vmovshdup_avx(auVar49);
    fVar102 = auVar49._0_4_;
    fVar70 = auVar42._0_4_;
    fVar59 = fVar102 * fVar70 * fVar58;
    auVar43 = vfmadd213ss_fma(ZEXT416((uint)(fVar102 * fVar102 * fVar67)),ZEXT416((uint)fVar58),
                              auVar77);
    auVar43 = vinsertps_avx512f(auVar43,ZEXT416((uint)(fVar67 * fVar59)),0x10);
    auVar44 = vmulss_avx512f(auVar49,auVar45 ^ auVar85);
    auVar49 = vfmadd213ss_fma(ZEXT416((uint)(fVar70 * fVar70)),ZEXT416((uint)fVar58),auVar45);
    auVar90._0_8_ = auVar42._0_8_ ^ 0x8000000080000000;
    auVar90._8_4_ = auVar42._8_4_ ^ 0x80000000;
    auVar90._12_4_ = auVar42._12_4_ ^ 0x80000000;
    auVar46 = vinsertps_avx(ZEXT416((uint)fVar59),auVar49,0x10);
  }
  else {
    auVar60._0_4_ = 1.0 / fVar102;
    auVar60._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar46 = vfmsub213ss_fma(ZEXT416((uint)fVar56),local_b8,ZEXT416((uint)(fVar57 * fVar70)));
    auVar45 = vfmadd231ss_fma(ZEXT416((uint)(fVar57 * fVar70)),local_c8,ZEXT416((uint)fVar57));
    auVar44._0_4_ = local_168._0_4_ * fVar70;
    auVar44._4_4_ = local_168._4_4_ * fVar70;
    auVar44._8_4_ = local_168._8_4_ * fVar70;
    auVar44._12_4_ = local_168._12_4_ * fVar70;
    uVar87 = local_b8._0_4_;
    auVar81._4_4_ = uVar87;
    auVar81._0_4_ = uVar87;
    auVar81._8_4_ = uVar87;
    auVar81._12_4_ = uVar87;
    auVar43 = vfmsub213ps_fma(auVar81,local_178,auVar44);
    uVar87 = local_c8._0_4_;
    auVar88._4_4_ = uVar87;
    auVar88._0_4_ = uVar87;
    auVar88._8_4_ = uVar87;
    auVar88._12_4_ = uVar87;
    auVar42 = vfmadd213ps_fma(auVar88,local_168,auVar44);
    auVar73._0_4_ = auVar42._0_4_ + auVar43._0_4_;
    auVar73._4_4_ = auVar42._4_4_ + auVar43._4_4_;
    auVar73._8_4_ = auVar42._8_4_ + auVar43._8_4_;
    auVar73._12_4_ = auVar42._12_4_ + auVar43._12_4_;
    auVar82._4_4_ = auVar60._0_4_;
    auVar82._0_4_ = auVar60._0_4_;
    auVar82._8_4_ = auVar60._0_4_;
    auVar82._12_4_ = auVar60._0_4_;
    auVar43 = vmulps_avx512vl(auVar73,auVar82);
    auVar44 = vmulss_avx512f(ZEXT416((uint)(auVar45._0_4_ + auVar46._0_4_)),auVar60);
    auVar47._4_4_ = fVar67;
    auVar47._0_4_ = fVar67;
    auVar47._8_4_ = fVar67;
    auVar47._12_4_ = fVar67;
    auVar74._0_4_ = local_178._0_4_ * fVar67;
    auVar74._4_4_ = local_178._4_4_ * fVar67;
    auVar74._8_4_ = local_178._8_4_ * fVar67;
    auVar74._12_4_ = local_178._12_4_ * fVar67;
    auVar45 = vfmsub213ss_fma(ZEXT416((uint)fVar57),local_88,ZEXT416((uint)(fVar56 * fVar67)));
    auVar48 = vfnmadd231ss_fma(ZEXT416((uint)(fVar56 * fVar67)),local_98,ZEXT416((uint)fVar56));
    uVar87 = local_88._0_4_;
    auVar93._4_4_ = uVar87;
    auVar93._0_4_ = uVar87;
    auVar93._8_4_ = uVar87;
    auVar93._12_4_ = uVar87;
    auVar42 = vfmsub213ps_fma(auVar93,local_168,auVar74);
    auVar47 = vfnmadd213ps_fma(auVar47,local_178,auVar74);
    auVar46._0_4_ = (auVar42._0_4_ + auVar47._0_4_) * auVar60._0_4_;
    auVar46._4_4_ = (auVar42._4_4_ + auVar47._4_4_) * auVar60._0_4_;
    auVar46._8_4_ = (auVar42._8_4_ + auVar47._8_4_) * auVar60._0_4_;
    auVar46._12_4_ = (auVar42._12_4_ + auVar47._12_4_) * auVar60._0_4_;
    fVar67 = (auVar45._0_4_ + auVar48._0_4_) * auVar60._0_4_;
    auVar90 = ZEXT416((uint)fVar67);
    auVar42 = vmulss_avx512f(ZEXT416((uint)fVar67),auVar43);
    auVar45 = vfmsub213ss_avx512f(auVar46,auVar44,auVar42);
    auVar42 = vfnmadd231ss_avx512f(auVar42,auVar43,ZEXT416((uint)fVar67));
    fVar102 = auVar45._0_4_ + auVar42._0_4_;
    auVar42 = vpermt2ps_avx512vl(auVar43,_DAT_00457a60,auVar44);
    auVar83._0_4_ = auVar42._0_4_ * auVar46._0_4_;
    auVar83._4_4_ = auVar42._4_4_ * auVar46._4_4_;
    auVar83._8_4_ = auVar42._8_4_ * auVar46._8_4_;
    auVar83._12_4_ = auVar42._12_4_ * auVar46._12_4_;
    auVar45 = vpermi2ps_avx512vl(_DAT_00457a60,auVar46,ZEXT416((uint)fVar67));
    auVar45 = vfmsub213ps_avx512vl(auVar45,auVar43,auVar83);
    auVar42 = vfnmadd213ps_fma(auVar42,auVar46,auVar83);
    fVar67 = auVar45._0_4_ + auVar42._0_4_;
    fVar70 = auVar45._4_4_ + auVar42._4_4_;
    fVar71 = auVar45._8_4_ + auVar42._8_4_;
    fVar72 = auVar45._12_4_ + auVar42._12_4_;
    auVar48._0_4_ = fVar67 * fVar67;
    auVar48._4_4_ = fVar70 * fVar70;
    auVar48._8_4_ = fVar71 * fVar71;
    auVar48._12_4_ = fVar72 * fVar72;
    auVar42 = vmovshdup_avx(auVar48);
    fVar102 = auVar48._0_4_ + auVar42._0_4_ + fVar102 * fVar102;
    if ((fVar102 == 0.0) && (!NAN(fVar102))) goto LAB_0022531d;
  }
  fVar59 = ti->b0;
  auVar97._4_4_ = fVar59;
  auVar97._0_4_ = fVar59;
  auVar97._8_4_ = fVar59;
  auVar97._12_4_ = fVar59;
  fVar58 = ti->b1;
  auVar104._4_4_ = fVar58;
  auVar104._0_4_ = fVar58;
  auVar104._8_4_ = fVar58;
  auVar104._12_4_ = fVar58;
  auVar49 = vmulss_avx512f(auVar50,auVar104);
  fVar102 = ti->b2;
  auVar109._4_4_ = fVar102;
  auVar109._0_4_ = fVar102;
  auVar109._8_4_ = fVar102;
  auVar109._12_4_ = fVar102;
  auVar91._0_4_ = local_108._0_4_ * fVar59;
  auVar91._4_4_ = local_108._4_4_ * fVar59;
  auVar91._8_4_ = local_108._8_4_ * fVar59;
  auVar91._12_4_ = local_108._12_4_ * fVar59;
  auVar95._0_4_ = local_118._0_4_ * fVar58;
  auVar95._4_4_ = local_118._4_4_ * fVar58;
  auVar95._8_4_ = local_118._8_4_ * fVar58;
  auVar95._12_4_ = local_118._12_4_ * fVar58;
  auVar50 = vmulps_avx512vl(local_128,auVar109);
  auVar51 = vmulss_avx512f(auVar51,auVar109);
  auVar112._0_4_ = auVar91._0_4_ + auVar95._0_4_ + auVar50._0_4_;
  auVar112._4_4_ = auVar91._4_4_ + auVar95._4_4_ + auVar50._4_4_;
  auVar112._8_4_ = auVar91._8_4_ + auVar95._8_4_ + auVar50._8_4_;
  auVar112._12_4_ = auVar91._12_4_ + auVar95._12_4_ + auVar50._12_4_;
  local_e8.z = fVar68 * fVar59 + auVar49._0_4_ + auVar51._0_4_;
  local_e8._0_8_ = vmovlps_avx(auVar112);
  auVar52 = vmulss_avx512f(auVar52,auVar97);
  auVar53 = vmulss_avx512f(auVar53,auVar97);
  auVar54 = vmulss_avx512f(auVar54,auVar104);
  auVar55 = vmulss_avx512f(auVar55,auVar104);
  local_148 = vinsertps_avx(ZEXT416((uint)(auVar52._0_4_ + auVar54._0_4_ + auVar116._0_4_ * fVar102)
                                   ),ZEXT416((uint)(auVar114._0_4_ * fVar102 +
                                                   auVar53._0_4_ + auVar55._0_4_)),0x10);
  iVar40 = 0;
  if (mesh->faceIndices != (int *)0x0) {
    iVar40 = mesh->faceIndices[triIndex];
  }
  bVar29 = mesh->reverseOrientation;
  bVar30 = mesh->transformSwapsHandedness;
  auVar54._8_4_ = 0x7fffffff;
  auVar54._0_8_ = 0x7fffffff7fffffff;
  auVar54._12_4_ = 0x7fffffff;
  auVar55 = vandps_avx(auVar91,auVar54);
  auVar53 = vandps_avx(auVar95,auVar54);
  auVar50 = vandps_avx(auVar50,auVar54);
  auVar52._0_4_ = auVar55._0_4_ + auVar53._0_4_ + auVar50._0_4_;
  auVar52._4_4_ = auVar55._4_4_ + auVar53._4_4_ + auVar50._4_4_;
  auVar52._8_4_ = auVar55._8_4_ + auVar53._8_4_ + auVar50._8_4_;
  auVar52._12_4_ = auVar55._12_4_ + auVar53._12_4_ + auVar50._12_4_;
  auVar50 = vandps_avx(ZEXT416((uint)(fVar68 * fVar59)),auVar54);
  auVar49 = vandps_avx(auVar49,auVar54);
  auVar51 = vandps_avx(auVar51,auVar54);
  auVar55._8_4_ = 0x34e00006;
  auVar55._0_8_ = 0x34e0000634e00006;
  auVar55._12_4_ = 0x34e00006;
  auVar55 = vmulps_avx512vl(auVar52,auVar55);
  local_58.z = (auVar50._0_4_ + auVar49._0_4_ + auVar51._0_4_) * 4.1723268e-07;
  local_58._0_8_ = vmovlps_avx(auVar55);
  local_138 = auVar46;
  local_128 = auVar90;
  local_118 = auVar44;
  local_108 = auVar43;
  Point3fi::Point3fi(&local_48,(Point3f *)&local_e8,(Vector3f *)&local_58);
  auVar51 = local_108;
  auVar49 = local_138;
  _va = 0;
  local_198 = 0;
  _vb = 0;
  local_1a8 = 0;
  pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y =
       local_48.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y;
  pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x =
       local_48.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x;
  pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z =
       local_48.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
  dpdu.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_118._0_4_;
  dpdu.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_108._0_4_;
  dpdu.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_108._4_4_;
  dpdv.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_128._0_4_;
  dpdv.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_138._0_4_;
  dpdv.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_138._4_4_;
  local_138 = auVar49;
  local_108 = auVar51;
  SurfaceInteraction::SurfaceInteraction
            (__return_storage_ptr__,pi,(Point2f)local_148._0_8_,(Vector3f)*local_f0,dpdu,dpdv,
             (Normal3f)ZEXT812(0),(Normal3f)ZEXT812(0),local_17c,bVar29 != bVar30);
  __return_storage_ptr__->faceIndex = iVar40;
  auVar49 = vmovshdup_avx(local_168);
  auVar51 = vmovshdup_avx(local_178);
  auVar55 = ZEXT416((uint)(auVar49._0_4_ * fVar56));
  auVar50 = vfmsub213ss_fma(ZEXT416((uint)fVar57),auVar51,auVar55);
  auVar55 = vfnmadd231ss_fma(auVar55,ZEXT416((uint)fVar56),auVar49);
  fVar68 = auVar50._0_4_ + auVar55._0_4_;
  auVar55 = ZEXT416((uint)(local_178._0_4_ * fVar57));
  auVar50 = vfmsub213ss_fma(ZEXT416((uint)fVar56),local_168,auVar55);
  auVar55 = vfnmadd213ss_fma(ZEXT416((uint)fVar57),local_178,auVar55);
  fVar59 = auVar50._0_4_ + auVar55._0_4_;
  auVar50 = ZEXT416((uint)(local_168._0_4_ * auVar51._0_4_));
  auVar49 = vfmsub213ss_fma(auVar49,local_178,auVar50);
  auVar51 = vfnmadd213ss_fma(local_168,auVar51,auVar50);
  fVar58 = auVar49._0_4_ + auVar51._0_4_;
  fVar102 = fVar58 * fVar58 + fVar68 * fVar68 + fVar59 * fVar59;
  if (fVar102 < 0.0) {
    local_168._0_4_ = fVar68;
    local_178._0_4_ = fVar59;
    fVar102 = sqrtf(fVar102);
    fVar68 = (float)local_168._0_4_;
    fVar59 = (float)local_178._0_4_;
  }
  else {
    auVar49 = vsqrtss_avx(ZEXT416((uint)fVar102),ZEXT416((uint)fVar102));
    fVar102 = auVar49._0_4_;
  }
  (__return_storage_ptr__->shading).n.super_Tuple3<pbrt::Normal3,_float>.x = fVar68 / fVar102;
  (__return_storage_ptr__->shading).n.super_Tuple3<pbrt::Normal3,_float>.y = fVar59 / fVar102;
  (__return_storage_ptr__->shading).n.super_Tuple3<pbrt::Normal3,_float>.z = fVar58 / fVar102;
  (__return_storage_ptr__->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z =
       (__return_storage_ptr__->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
  fVar68 = (__return_storage_ptr__->shading).n.super_Tuple3<pbrt::Normal3,_float>.y;
  (__return_storage_ptr__->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x =
       (__return_storage_ptr__->shading).n.super_Tuple3<pbrt::Normal3,_float>.x;
  (__return_storage_ptr__->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y = fVar68;
  if (mesh->reverseOrientation != mesh->transformSwapsHandedness) {
    uVar14._0_4_ = (__return_storage_ptr__->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.
                   x;
    uVar14._4_4_ = (__return_storage_ptr__->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.
                   y;
    auVar53._0_8_ = uVar14 ^ 0x8000000080000000;
    auVar53._8_4_ = 0x80000000;
    auVar53._12_4_ = 0x80000000;
    fVar68 = (__return_storage_ptr__->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z;
    uVar15 = vmovlps_avx(auVar53);
    (__return_storage_ptr__->shading).n.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar15;
    (__return_storage_ptr__->shading).n.super_Tuple3<pbrt::Normal3,_float>.y =
         (float)(int)((ulong)uVar15 >> 0x20);
    (__return_storage_ptr__->shading).n.super_Tuple3<pbrt::Normal3,_float>.z = -fVar68;
    (__return_storage_ptr__->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z =
         (__return_storage_ptr__->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
    fVar68 = (__return_storage_ptr__->shading).n.super_Tuple3<pbrt::Normal3,_float>.y;
    (__return_storage_ptr__->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x =
         (__return_storage_ptr__->shading).n.super_Tuple3<pbrt::Normal3,_float>.x;
    (__return_storage_ptr__->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y = fVar68;
  }
  pNVar34 = mesh->n;
  if (pNVar34 == (Normal3f *)0x0) {
    if (mesh->s == (Vector3f *)0x0) {
      return __return_storage_ptr__;
    }
LAB_002259a6:
    uVar6 = (__return_storage_ptr__->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x;
    uVar22 = (__return_storage_ptr__->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y;
    auVar65._4_4_ = uVar22;
    auVar65._0_4_ = uVar6;
    auVar65._8_8_ = 0;
    fVar68 = (__return_storage_ptr__->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z;
  }
  else {
    fVar68 = ti->b0;
    fVar59 = ti->b1;
    fVar58 = ti->b2;
    uVar3 = pNVar34[piVar31[lVar41]].super_Tuple3<pbrt::Normal3,_float>.x;
    uVar19 = pNVar34[piVar31[lVar41]].super_Tuple3<pbrt::Normal3,_float>.y;
    uVar4 = pNVar34[piVar31[lVar41 + 1]].super_Tuple3<pbrt::Normal3,_float>.x;
    uVar20 = pNVar34[piVar31[lVar41 + 1]].super_Tuple3<pbrt::Normal3,_float>.y;
    uVar5 = pNVar34[piVar31[lVar41 + 2]].super_Tuple3<pbrt::Normal3,_float>.x;
    uVar21 = pNVar34[piVar31[lVar41 + 2]].super_Tuple3<pbrt::Normal3,_float>.y;
    auVar78._0_4_ = fVar68 * (float)uVar3 + fVar59 * (float)uVar4 + fVar58 * (float)uVar5;
    auVar78._4_4_ = fVar68 * (float)uVar19 + fVar59 * (float)uVar20 + fVar58 * (float)uVar21;
    auVar78._8_4_ = fVar68 * 0.0 + fVar59 * 0.0 + fVar58 * 0.0;
    auVar78._12_4_ = fVar68 * 0.0 + fVar59 * 0.0 + fVar58 * 0.0;
    auVar64._0_4_ = auVar78._0_4_ * auVar78._0_4_;
    auVar64._4_4_ = auVar78._4_4_ * auVar78._4_4_;
    auVar64._8_4_ = auVar78._8_4_ * auVar78._8_4_;
    auVar64._12_4_ = auVar78._12_4_ * auVar78._12_4_;
    auVar49 = vhaddps_avx(auVar64,auVar64);
    fVar68 = fVar68 * pNVar34[piVar31[lVar41]].super_Tuple3<pbrt::Normal3,_float>.z +
             fVar59 * pNVar34[piVar31[lVar41 + 1]].super_Tuple3<pbrt::Normal3,_float>.z +
             fVar58 * pNVar34[piVar31[lVar41 + 2]].super_Tuple3<pbrt::Normal3,_float>.z;
    fVar59 = auVar49._0_4_ + fVar68 * fVar68;
    if (fVar59 <= 0.0) goto LAB_002259a6;
    if (fVar59 < 0.0) {
      local_178._0_4_ = fVar68;
      local_168 = auVar78;
      fVar59 = sqrtf(fVar59);
      fVar68 = (float)local_178._0_4_;
      auVar78 = local_168;
    }
    else {
      auVar49 = vsqrtss_avx(ZEXT416((uint)fVar59),ZEXT416((uint)fVar59));
      fVar59 = auVar49._0_4_;
    }
    auVar66._4_4_ = fVar59;
    auVar66._0_4_ = fVar59;
    auVar66._8_4_ = fVar59;
    auVar66._12_4_ = fVar59;
    auVar65 = vdivps_avx(auVar78,auVar66);
    fVar68 = fVar68 / fVar59;
  }
  auVar49 = ZEXT416((uint)fVar68);
  pVVar35 = mesh->s;
  if (pVVar35 != (Vector3f *)0x0) {
    fVar59 = ti->b0;
    fVar58 = ti->b1;
    fVar102 = ti->b2;
    uVar7 = pVVar35[piVar31[lVar41]].super_Tuple3<pbrt::Vector3,_float>.x;
    uVar23 = pVVar35[piVar31[lVar41]].super_Tuple3<pbrt::Vector3,_float>.y;
    uVar8 = pVVar35[piVar31[lVar41 + 1]].super_Tuple3<pbrt::Vector3,_float>.x;
    uVar24 = pVVar35[piVar31[lVar41 + 1]].super_Tuple3<pbrt::Vector3,_float>.y;
    uVar9 = pVVar35[piVar31[lVar41 + 2]].super_Tuple3<pbrt::Vector3,_float>.x;
    uVar25 = pVVar35[piVar31[lVar41 + 2]].super_Tuple3<pbrt::Vector3,_float>.y;
    auVar79._0_4_ = fVar59 * (float)uVar7 + fVar58 * (float)uVar8 + fVar102 * (float)uVar9;
    auVar79._4_4_ = fVar59 * (float)uVar23 + fVar58 * (float)uVar24 + fVar102 * (float)uVar25;
    auVar79._8_4_ = fVar59 * 0.0 + fVar58 * 0.0 + fVar102 * 0.0;
    auVar79._12_4_ = fVar59 * 0.0 + fVar58 * 0.0 + fVar102 * 0.0;
    auVar92._0_4_ = auVar79._0_4_ * auVar79._0_4_;
    auVar92._4_4_ = auVar79._4_4_ * auVar79._4_4_;
    auVar92._8_4_ = auVar79._8_4_ * auVar79._8_4_;
    auVar92._12_4_ = auVar79._12_4_ * auVar79._12_4_;
    auVar51 = vhaddps_avx(auVar92,auVar92);
    fVar59 = fVar59 * pVVar35[piVar31[lVar41]].super_Tuple3<pbrt::Vector3,_float>.z +
             fVar58 * pVVar35[piVar31[lVar41 + 1]].super_Tuple3<pbrt::Vector3,_float>.z +
             fVar102 * pVVar35[piVar31[lVar41 + 2]].super_Tuple3<pbrt::Vector3,_float>.z;
    auVar50 = ZEXT416((uint)fVar59);
    fVar59 = auVar51._0_4_ + fVar59 * fVar59;
    if ((fVar59 != 0.0) || (NAN(fVar59))) goto LAB_00225a7c;
  }
  uVar10 = (__return_storage_ptr__->dpdu).super_Tuple3<pbrt::Vector3,_float>.x;
  uVar26 = (__return_storage_ptr__->dpdu).super_Tuple3<pbrt::Vector3,_float>.y;
  auVar79._4_4_ = (float)uVar26;
  auVar79._0_4_ = (float)uVar10;
  auVar79._8_8_ = 0;
  auVar50 = ZEXT416((uint)(__return_storage_ptr__->dpdu).super_Tuple3<pbrt::Vector3,_float>.z);
LAB_00225a7c:
  auVar51 = vmovshdup_avx(auVar65);
  auVar55 = vmovshdup_avx(auVar79);
  auVar52 = ZEXT416((uint)(fVar68 * auVar55._0_4_));
  auVar53 = vfmsub213ss_fma(auVar50,auVar51,auVar52);
  auVar52 = vfnmadd231ss_fma(auVar52,auVar49,auVar55);
  fVar59 = auVar53._0_4_ + auVar52._0_4_;
  fVar56 = auVar65._0_4_;
  auVar52 = ZEXT416((uint)(fVar56 * auVar50._0_4_));
  auVar53 = vfmsub213ss_fma(auVar79,auVar49,auVar52);
  auVar50 = vfnmadd213ss_fma(auVar50,auVar65,auVar52);
  fVar58 = auVar53._0_4_ + auVar50._0_4_;
  fVar57 = auVar51._0_4_;
  auVar53 = ZEXT416((uint)(fVar57 * auVar79._0_4_));
  auVar50 = vfmsub213ss_fma(auVar55,auVar65,auVar53);
  auVar55 = vfnmadd213ss_fma(auVar79,auVar51,auVar53);
  fVar102 = auVar50._0_4_ + auVar55._0_4_;
  auVar114 = ZEXT464((uint)fVar102);
  if (fVar102 * fVar102 + fVar59 * fVar59 + fVar58 * fVar58 <= 0.0) {
    auVar80._8_4_ = 0x3f800000;
    auVar80._0_8_ = 0x3f8000003f800000;
    auVar80._12_4_ = 0x3f800000;
    auVar86._8_4_ = 0x80000000;
    auVar86._0_8_ = 0x8000000080000000;
    auVar86._12_4_ = 0x80000000;
    auVar39._8_4_ = 0x80000000;
    auVar39._0_8_ = 0x8000000080000000;
    auVar39._12_4_ = 0x80000000;
    auVar51 = vxorps_avx512vl(auVar51,auVar39);
    auVar114 = ZEXT1664(auVar51);
    auVar51 = vpternlogd_avx512vl(auVar80,auVar49,auVar86,0xf8);
    fVar58 = auVar51._0_4_;
    fVar102 = -1.0 / (fVar68 + fVar58);
    fVar59 = fVar56 * fVar57 * fVar102;
    auVar49 = vfmadd213ss_fma(ZEXT416((uint)(fVar56 * fVar58 * fVar56)),ZEXT416((uint)fVar102),
                              auVar80);
    auVar49 = vinsertps_avx(auVar49,ZEXT416((uint)(fVar59 * fVar58)),0x10);
    fVar56 = fVar56 * -fVar58;
    auVar51 = vfmadd213ss_fma(ZEXT416((uint)(fVar57 * fVar57)),ZEXT416((uint)fVar102),auVar51);
    auVar50 = vinsertps_avx(ZEXT416((uint)fVar59),auVar51,0x10);
  }
  else {
    auVar54 = ZEXT416((uint)fVar59);
    auVar42 = ZEXT416((uint)fVar58);
    auVar50 = vinsertps_avx(auVar54,auVar42,0x10);
    auVar55 = vfmsub213ss_fma(auVar49,auVar42,ZEXT416((uint)(fVar57 * fVar102)));
    auVar52 = vfnmadd231ss_fma(ZEXT416((uint)(fVar57 * fVar102)),ZEXT416((uint)fVar102),auVar51);
    auVar53 = vfmsub213ss_fma(auVar65,ZEXT416((uint)fVar102),ZEXT416((uint)(fVar68 * fVar59)));
    auVar49 = vfnmadd231ss_fma(ZEXT416((uint)(fVar68 * fVar59)),auVar54,auVar49);
    auVar49 = vinsertps_avx(ZEXT416((uint)(auVar55._0_4_ + auVar52._0_4_)),
                            ZEXT416((uint)(auVar53._0_4_ + auVar49._0_4_)),0x10);
    auVar51 = vfmsub213ss_fma(auVar54,auVar51,ZEXT416((uint)(fVar56 * fVar58)));
    auVar55 = vfnmadd213ss_fma(auVar42,auVar65,ZEXT416((uint)(fVar56 * fVar58)));
    fVar56 = auVar51._0_4_ + auVar55._0_4_;
  }
  pNVar34 = mesh->n;
  auVar107 = ZEXT816(0);
  if (pNVar34 == (Normal3f *)0x0) {
    local_150 = 0.0;
    auVar116 = ZEXT864(0) << 0x20;
    fVar59 = 0.0;
  }
  else {
    fVar58 = pNVar34[piVar31[lVar41]].super_Tuple3<pbrt::Normal3,_float>.z;
    fVar59 = pNVar34[piVar31[lVar41 + 2]].super_Tuple3<pbrt::Normal3,_float>.z;
    fVar102 = pNVar34[piVar31[lVar41 + 1]].super_Tuple3<pbrt::Normal3,_float>.x;
    uVar16._0_4_ = pNVar34[piVar31[lVar41]].super_Tuple3<pbrt::Normal3,_float>.x;
    uVar16._4_4_ = pNVar34[piVar31[lVar41]].super_Tuple3<pbrt::Normal3,_float>.y;
    auVar98._8_8_ = 0;
    auVar98._0_8_ = uVar16;
    uVar11 = pNVar34[piVar31[lVar41 + 2]].super_Tuple3<pbrt::Normal3,_float>.x;
    uVar27 = pNVar34[piVar31[lVar41 + 2]].super_Tuple3<pbrt::Normal3,_float>.y;
    auVar113._4_4_ = uVar27;
    auVar113._0_4_ = uVar11;
    auVar113._8_8_ = 0;
    uVar12 = pNVar34[piVar31[lVar41 + 1]].super_Tuple3<pbrt::Normal3,_float>.y;
    uVar28 = pNVar34[piVar31[lVar41 + 1]].super_Tuple3<pbrt::Normal3,_float>.z;
    auVar110._4_4_ = uVar28;
    auVar110._0_4_ = uVar12;
    auVar110._8_8_ = 0;
    if (1e-09 <= (float)local_68._0_4_) {
      auVar51 = vmovshdup_avx(auVar110);
      fVar57 = auVar51._0_4_ - fVar59;
      fVar58 = fVar58 - fVar59;
      local_150 = 1.0 / (float)local_d8._0_4_;
      auVar51 = vmulss_avx512f(local_a8,ZEXT416((uint)fVar57));
      auVar55 = vfmsub213ss_avx512f(ZEXT416((uint)fVar58),local_b8,auVar51);
      auVar51 = vfmadd213ss_fma(local_c8,ZEXT416((uint)fVar57),auVar51);
      fVar59 = local_150 * (auVar55._0_4_ + auVar51._0_4_);
      auVar51 = vmulss_avx512f(local_98,ZEXT416((uint)fVar58));
      auVar54 = vfmsub213ss_fma(ZEXT416((uint)fVar57),local_88,auVar51);
      auVar42 = vfnmadd213ss_avx512f(ZEXT416((uint)fVar58),local_98,auVar51);
      auVar51 = vpermi2ps_avx512vl(SUB6416(ZEXT464(4),0),auVar110,ZEXT416((uint)fVar102));
      auVar51 = vsubps_avx(auVar51,auVar113);
      auVar55 = vsubps_avx(auVar98,auVar113);
      auVar53 = vbroadcastss_avx512vl(local_a8);
      auVar101._0_4_ = auVar51._0_4_ * auVar53._0_4_;
      auVar101._4_4_ = auVar51._4_4_ * auVar53._4_4_;
      auVar101._8_4_ = auVar51._8_4_ * auVar53._8_4_;
      auVar101._12_4_ = auVar51._12_4_ * auVar53._12_4_;
      auVar53 = vbroadcastss_avx512vl(local_b8);
      auVar52 = vfmsub213ps_fma(auVar53,auVar55,auVar101);
      auVar53 = vbroadcastss_avx512vl(local_c8);
      auVar53 = vfmadd213ps_fma(auVar53,auVar51,auVar101);
      auVar116 = ZEXT1664(CONCAT412(local_150 * (auVar52._12_4_ + auVar53._12_4_),
                                    CONCAT48(local_150 * (auVar52._8_4_ + auVar53._8_4_),
                                             CONCAT44(local_150 * (auVar52._4_4_ + auVar53._4_4_),
                                                      local_150 * (auVar52._0_4_ + auVar53._0_4_))))
                         );
      auVar53 = vbroadcastss_avx512vl(local_98);
      auVar118._0_4_ = auVar53._0_4_ * auVar55._0_4_;
      auVar118._4_4_ = auVar53._4_4_ * auVar55._4_4_;
      auVar118._8_4_ = auVar53._8_4_ * auVar55._8_4_;
      auVar118._12_4_ = auVar53._12_4_ * auVar55._12_4_;
      auVar119._0_4_ = local_88._0_4_;
      auVar119._4_4_ = auVar119._0_4_;
      auVar119._8_4_ = auVar119._0_4_;
      auVar119._12_4_ = auVar119._0_4_;
      auVar51 = vfmsub213ps_fma(auVar119,auVar51,auVar118);
      auVar55 = vfnmadd213ps_fma(auVar55,auVar53,auVar118);
      auVar107._0_4_ = local_150 * (auVar55._0_4_ + auVar51._0_4_);
      auVar107._4_4_ = local_150 * (auVar55._4_4_ + auVar51._4_4_);
      auVar107._8_4_ = local_150 * (auVar55._8_4_ + auVar51._8_4_);
      auVar107._12_4_ = local_150 * (auVar55._12_4_ + auVar51._12_4_);
      local_150 = local_150 * (auVar42._0_4_ + auVar54._0_4_);
    }
    else {
      auVar55 = vsubps_avx(auVar113,auVar98);
      auVar51 = vpermt2ps_avx512vl(auVar98,_DAT_00457a60,ZEXT416((uint)fVar58));
      auVar53 = vsubps_avx(auVar110,auVar51);
      auVar51 = vmovshdup_avx(auVar53);
      auVar52 = ZEXT416((uint)(fVar102 - (float)(undefined4)uVar16));
      auVar54 = vpermi2ps_avx512vl(SUB6416(ZEXT464(4),0),auVar53,auVar52);
      auVar42 = ZEXT416((uint)(auVar55._0_4_ * auVar51._0_4_));
      auVar52 = vfmsub213ss_fma(auVar52,ZEXT416((uint)(fVar59 - fVar58)),auVar42);
      auVar51 = vfnmadd213ss_fma(auVar51,auVar55,auVar42);
      fVar102 = auVar52._0_4_ + auVar51._0_4_;
      auVar52 = vpermi2ps_avx512vl(_DAT_00457a60,auVar55,ZEXT416((uint)(fVar59 - fVar58)));
      auVar105._0_4_ = auVar52._0_4_ * auVar54._0_4_;
      auVar105._4_4_ = auVar52._4_4_ * auVar54._4_4_;
      auVar105._8_4_ = auVar52._8_4_ * auVar54._8_4_;
      auVar105._12_4_ = auVar52._12_4_ * auVar54._12_4_;
      auVar51 = vfmsub213ps_fma(auVar53,auVar55,auVar105);
      auVar55 = vfnmadd213ps_fma(auVar54,auVar52,auVar105);
      auVar115._0_4_ = auVar55._0_4_ + auVar51._0_4_;
      auVar115._4_4_ = auVar55._4_4_ + auVar51._4_4_;
      auVar115._8_4_ = auVar55._8_4_ + auVar51._8_4_;
      auVar115._12_4_ = auVar55._12_4_ + auVar51._12_4_;
      auVar99._0_4_ = auVar115._0_4_ * auVar115._0_4_;
      auVar99._4_4_ = auVar115._4_4_ * auVar115._4_4_;
      auVar99._8_4_ = auVar115._8_4_ * auVar115._8_4_;
      auVar99._12_4_ = auVar115._12_4_ * auVar115._12_4_;
      auVar51 = vmovshdup_avx(auVar99);
      fVar58 = auVar99._0_4_ + fVar102 * fVar102 + auVar51._0_4_;
      local_150 = 0.0;
      auVar116 = ZEXT1264(ZEXT812(0));
      fVar59 = 0.0;
      if ((fVar58 != 0.0) || (NAN(fVar58))) {
        auVar100._8_4_ = 0x3f800000;
        auVar100._0_8_ = 0x3f8000003f800000;
        auVar100._12_4_ = 0x3f800000;
        auVar108._8_4_ = 0x80000000;
        auVar108._0_8_ = 0x8000000080000000;
        auVar108._12_4_ = 0x80000000;
        auVar55 = vpternlogd_avx512vl(auVar100,auVar115,auVar108,0xf8);
        fVar57 = auVar55._0_4_;
        auVar117._0_4_ = -1.0 / (auVar115._0_4_ + fVar57);
        auVar117._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar51 = vmovshdup_avx(auVar115);
        fVar59 = auVar51._0_4_;
        fVar58 = fVar102 * fVar59 * auVar117._0_4_;
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(fVar57 * fVar59 * fVar59)),auVar117,auVar100);
        auVar51 = vinsertps_avx(auVar51,ZEXT416((uint)(fVar57 * fVar58)),0x10);
        auVar116 = ZEXT1664(auVar51);
        fVar59 = -fVar57 * fVar59;
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(fVar102 * fVar102)),auVar117,auVar55);
        local_150 = -fVar102;
        auVar107 = vinsertps_avx(ZEXT416((uint)fVar58),auVar51,0x10);
      }
    }
  }
  local_158 = vmovlps_avx(auVar107);
  dndvs.super_Tuple3<pbrt::Normal3,_float>.z = local_150;
  dndvs.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)local_158;
  dndvs.super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)((ulong)local_158 >> 0x20);
  ns.super_Tuple3<pbrt::Normal3,_float>._0_8_ = auVar65._0_8_;
  ns.super_Tuple3<pbrt::Normal3,_float>.z = fVar68;
  dpdus.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar49._0_8_;
  dpdus.super_Tuple3<pbrt::Vector3,_float>.z = fVar56;
  dpdvs.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar50._0_8_;
  dpdvs.super_Tuple3<pbrt::Vector3,_float>.z = auVar114._0_4_;
  dndus.super_Tuple3<pbrt::Normal3,_float>._0_8_ = auVar116._0_8_;
  dndus.super_Tuple3<pbrt::Normal3,_float>.z = fVar59;
  SurfaceInteraction::SetShadingGeometry(__return_storage_ptr__,ns,dpdus,dpdvs,dndus,dndvs,true);
  return __return_storage_ptr__;
}

Assistant:

InteractionFromIntersection(const TriangleMesh *mesh,
                                                          int triIndex,
                                                          const TriangleIntersection &ti,
                                                          Float time,
                                                          const Vector3f &wo) {
        const int *v = &mesh->vertexIndices[3 * triIndex];
        Point3f p0 = mesh->p[v[0]], p1 = mesh->p[v[1]], p2 = mesh->p[v[2]];
        // Compute triangle partial derivatives
        // Compute deltas and matrix determinant for triangle partial derivatives
        // Get triangle texture coordinates in _uv_ array
        pstd::array<Point2f, 3> uv =
            mesh->uv
                ? pstd::array<Point2f, 3>(
                      {mesh->uv[v[0]], mesh->uv[v[1]], mesh->uv[v[2]]})
                : pstd::array<Point2f, 3>({Point2f(0, 0), Point2f(1, 0), Point2f(1, 1)});

        Vector2f duv02 = uv[0] - uv[2], duv12 = uv[1] - uv[2];
        Vector3f dp02 = p0 - p2, dp12 = p1 - p2;
        Float determinant = DifferenceOfProducts(duv02[0], duv12[1], duv02[1], duv12[0]);

        Vector3f dpdu, dpdv;
        bool degenerateUV = std::abs(determinant) < 1e-9f;
        if (!degenerateUV) {
            // Compute triangle $\dpdu$ and $\dpdv$ via matrix inversion
            Float invdet = 1 / determinant;
            dpdu = DifferenceOfProducts(duv12[1], dp02, duv02[1], dp12) * invdet;
            dpdv = DifferenceOfProducts(duv02[0], dp12, duv12[0], dp02) * invdet;
        }
        // Handle degenerate triangle $(u,v)$ parameterization or partial derivatives
        if (degenerateUV || LengthSquared(Cross(dpdu, dpdv)) == 0) {
            Vector3f ng = Cross(p2 - p0, p1 - p0);
            if (LengthSquared(ng) == 0) {
                ng = Vector3f(Cross(Vector3<double>(p2 - p0), Vector3<double>(p1 - p0)));
                CHECK_NE(LengthSquared(ng), 0);
            }
            CoordinateSystem(Normalize(ng), &dpdu, &dpdv);
        }

        // Interpolate $(u,v)$ parametric coordinates and hit point
        Point3f pHit = ti.b0 * p0 + ti.b1 * p1 + ti.b2 * p2;
        Point2f uvHit = ti.b0 * uv[0] + ti.b1 * uv[1] + ti.b2 * uv[2];

        // Return _SurfaceInteraction_ for triangle hit
        int faceIndex = mesh->faceIndices ? mesh->faceIndices[triIndex] : 0;
        bool flipNormal = mesh->reverseOrientation ^ mesh->transformSwapsHandedness;
        // Compute error bounds _pError_ for triangle intersection
        Float xAbsSum =
            (std::abs(ti.b0 * p0.x) + std::abs(ti.b1 * p1.x) + std::abs(ti.b2 * p2.x));
        Float yAbsSum =
            (std::abs(ti.b0 * p0.y) + std::abs(ti.b1 * p1.y) + std::abs(ti.b2 * p2.y));
        Float zAbsSum =
            (std::abs(ti.b0 * p0.z) + std::abs(ti.b1 * p1.z) + std::abs(ti.b2 * p2.z));
        Vector3f pError = gamma(7) * Vector3f(xAbsSum, yAbsSum, zAbsSum);

        SurfaceInteraction isect(Point3fi(pHit, pError), uvHit, wo, dpdu, dpdv,
                                 Normal3f(), Normal3f(), time, flipNormal, faceIndex);
        // Set final surface normal and shading geometry for triangle
        // Override surface normal in _isect_ for triangle
        isect.n = isect.shading.n = Normal3f(Normalize(Cross(dp02, dp12)));
        if (mesh->reverseOrientation ^ mesh->transformSwapsHandedness)
            isect.n = isect.shading.n = -isect.n;

        if (mesh->n || mesh->s) {
            // Initialize _Triangle_ shading geometry
            // Compute shading normal _ns_ for triangle
            Normal3f ns;
            if (mesh->n != nullptr) {
                ns =
                    ti.b0 * mesh->n[v[0]] + ti.b1 * mesh->n[v[1]] + ti.b2 * mesh->n[v[2]];
                ns = LengthSquared(ns) > 0 ? Normalize(ns) : isect.n;
            } else
                ns = isect.n;

            // Compute shading tangent _ss_ for triangle
            Vector3f ss;
            if (mesh->s != nullptr) {
                ss =
                    ti.b0 * mesh->s[v[0]] + ti.b1 * mesh->s[v[1]] + ti.b2 * mesh->s[v[2]];
                if (LengthSquared(ss) == 0)
                    ss = isect.dpdu;
            } else
                ss = isect.dpdu;

            // Compute shading bitangent _ts_ for triangle and adjust _ss_
            Vector3f ts = Cross(ns, ss);
            if (LengthSquared(ts) > 0)
                ss = Cross(ts, ns);
            else
                CoordinateSystem(ns, &ss, &ts);

            // Compute $\dndu$ and $\dndv$ for triangle shading geometry
            Normal3f dndu, dndv;
            if (mesh->n != nullptr) {
                // Compute deltas for triangle partial derivatives of normal
                Vector2f duv02 = uv[0] - uv[2];
                Vector2f duv12 = uv[1] - uv[2];
                Normal3f dn1 = mesh->n[v[0]] - mesh->n[v[2]];
                Normal3f dn2 = mesh->n[v[1]] - mesh->n[v[2]];

                Float determinant =
                    DifferenceOfProducts(duv02[0], duv12[1], duv02[1], duv12[0]);
                bool degenerateUV = std::abs(determinant) < 1e-9;
                if (degenerateUV) {
                    // We can still compute dndu and dndv, with respect to the
                    // same arbitrary coordinate system we use to compute dpdu
                    // and dpdv when this happens. It's important to do this
                    // (rather than giving up) so that ray differentials for
                    // rays reflected from triangles with degenerate
                    // parameterizations are still reasonable.
                    Vector3f dn = Cross(Vector3f(mesh->n[v[2]] - mesh->n[v[0]]),
                                        Vector3f(mesh->n[v[1]] - mesh->n[v[0]]));

                    if (LengthSquared(dn) == 0)
                        dndu = dndv = Normal3f(0, 0, 0);
                    else {
                        Vector3f dnu, dnv;
                        CoordinateSystem(dn, &dnu, &dnv);
                        dndu = Normal3f(dnu);
                        dndv = Normal3f(dnv);
                    }
                } else {
                    Float invDet = 1 / determinant;
                    dndu = DifferenceOfProducts(duv12[1], dn1, duv02[1], dn2) * invDet;
                    dndv = DifferenceOfProducts(duv02[0], dn2, duv12[0], dn1) * invDet;
                }
            } else
                dndu = dndv = Normal3f(0, 0, 0);

            isect.SetShadingGeometry(ns, ss, ts, dndu, dndv, true);
        }

        return isect;
    }